

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::append<char[1]>(path *this,char (*source) [1])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  format fmt;
  path local_60;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  undefined1 *puVar3;
  
  local_40 = local_30;
  sVar2 = strlen(*source);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,source,source + sVar2);
  paVar1 = &local_60._path.field_2;
  puVar3 = local_40;
  local_60._path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_60,local_40,local_40 + local_38);
  fmt = (format)puVar3;
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  postprocess_path_with_format(&local_60,fmt);
  operator/=(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._path._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._path._M_dataplus._M_p);
  }
  return this;
}

Assistant:

inline path& path::append(const Source& source)
{
    return this->operator/=(path(source));
}